

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O3

void __thiscall wasm::ExecutionResults::printValue(ExecutionResults *this,Literal *value)

{
  Type *this_00;
  char cVar1;
  bool bVar2;
  HeapType HVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  Literal *this_01;
  Literal in_stack_ffffffffffffff88;
  Literal local_58;
  undefined1 local_40 [8];
  Type type;
  char local_21;
  
  this_00 = &value->type;
  cVar1 = wasm::Type::isSubType((Type)(value->type).id,(Type)0xa);
  if ((cVar1 != '\0') && (bVar2 = Type::isString(this_00), !bVar2)) {
    wasm::Literal::internalize();
    wasm::Literal::operator=(value,(Literal *)local_40);
    wasm::Literal::~Literal((Literal *)local_40);
  }
  if (((this_00->id & 1) == 0 && 6 < this_00->id) &&
     (HVar3 = Type::getHeapType(this_00), ((uint)HVar3.id & 0x7b) == 0x20 && HVar3.id < 0x7d)) {
    wasm::Literal::externalize();
    wasm::Literal::operator=(value,(Literal *)local_40);
    wasm::Literal::~Literal((Literal *)local_40);
  }
  local_40 = (undefined1  [8])this_00->id;
  if (((ulong)local_40 & 1) == 0 && 6 < (ulong)local_40) {
    bVar2 = Type::isString((Type *)local_40);
    if ((!bVar2) &&
       (HVar3 = Type::getHeapType((Type *)local_40),
       ((uint)HVar3.id & 0x7b) != 0x30 || 0x7c < HVar3.id)) {
      bVar2 = Type::isNull(this_00);
      if (bVar2) {
        pcVar6 = "null\n";
        lVar5 = 5;
      }
      else {
        bVar2 = Type::isFunction((Type *)local_40);
        if (bVar2) {
          pcVar6 = "function\n";
          lVar5 = 9;
        }
        else {
          pcVar6 = "object\n";
          lVar5 = 7;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
      return;
    }
    wasm::Literal::Literal((Literal *)&stack0xffffffffffffff90,value);
    poVar4 = (ostream *)wasm::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff88);
    local_21 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_21,1);
    this_01 = (Literal *)&stack0xffffffffffffff90;
  }
  else {
    wasm::Literal::Literal(&local_58,value);
    poVar4 = (ostream *)wasm::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff88);
    local_21 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_21,1);
    this_01 = &local_58;
  }
  wasm::Literal::~Literal(this_01);
  return;
}

Assistant:

void printValue(Literal value) {
    // Unwrap an externalized GC value to get the actual value, but not strings,
    // which are normally a subtype of ext.
    if (Type::isSubType(value.type, Type(HeapType::ext, Nullable)) &&
        !value.type.isString()) {
      value = value.internalize();
    }

    // An anyref literal is a string.
    if (value.type.isRef() &&
        value.type.getHeapType().isMaybeShared(HeapType::any)) {
      value = value.externalize();
    }

    // Don't print most reference values, as e.g. funcref(N) contains an index,
    // which is not guaranteed to remain identical after optimizations. Do not
    // print the type in detail (as even that may change due to closed-world
    // optimizations); just print a simple type like JS does, 'object' or
    // 'function', but also print null for a null (so a null function does not
    // get printed as object, as in JS we have typeof null == 'object').
    //
    // The only references we print in full are strings and i31s, which have
    // simple and stable internal structures that optimizations will not alter.
    auto type = value.type;
    if (type.isRef()) {
      if (type.isString() || type.getHeapType().isMaybeShared(HeapType::i31)) {
        std::cout << value << '\n';
      } else if (value.isNull()) {
        std::cout << "null\n";
      } else if (type.isFunction()) {
        std::cout << "function\n";
      } else {
        std::cout << "object\n";
      }
      return;
    }

    // Non-references can be printed in full.
    std::cout << value << '\n';
  }